

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

void __thiscall
ShadingWriter::WriteColorInterpolation
          (ShadingWriter *this,IByteWriter *inWriter,PrimitiveObjectsWriter *inPrimitiveWriter,
          FT_Byte inColorStart,FT_Byte inColorEnd,double inStopDiff)

{
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  allocator<char> local_49;
  undefined8 local_48;
  undefined8 local_40;
  double local_28;
  
  local_28 = inStopDiff;
  if (inColorEnd == inColorStart) {
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,(double)inColorEnd / 255.0,eTokenSeparatorSpace);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"dup ",&local_49);
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_48,local_40);
    std::__cxx11::string::~string((string *)&local_48);
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,
               (double)(CONCAT31(in_register_00000081,inColorEnd) -
                       CONCAT31(in_register_00000009,inColorStart)) / (local_28 * 255.0),
               eTokenSeparatorSpace);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mul ",&local_49);
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_48,local_40);
    std::__cxx11::string::~string((string *)&local_48);
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,(double)inColorStart / 255.0,eTokenSeparatorSpace);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"add ",&local_49);
    (*inWriter->_vptr_IByteWriter[2])(inWriter,local_48,local_40);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"exch ",&local_49);
  (*inWriter->_vptr_IByteWriter[2])(inWriter,local_48,local_40);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ShadingWriter::WriteColorInterpolation(
    IByteWriter* inWriter,
    PrimitiveObjectsWriter* inPrimitiveWriter,
    FT_Byte inColorStart, 
    FT_Byte inColorEnd, 
    double inStopDiff) {
    if(inColorEnd == inColorStart) {
        // same color...so just put it there
        inPrimitiveWriter->WriteDouble(inColorEnd/255.0);
    } else {
        // interpolate
        WriteStreamText(inWriter, "dup ");
        inPrimitiveWriter->WriteDouble((inColorEnd - inColorStart)/(inStopDiff*255.0));
        WriteStreamText(inWriter, "mul ");
        inPrimitiveWriter->WriteDouble(inColorStart/255.0);
        WriteStreamText(inWriter, "add ");
    }
    WriteStreamText(inWriter, "exch ");
}